

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O2

int isobusfs_recv_err(int sock,isobusfs_err_msg *emsg)

{
  int iVar1;
  __u32 __errnum;
  size_t sVar2;
  isobusfs_stats *piVar3;
  ssize_t sVar4;
  int *piVar5;
  char *pcVar6;
  cmsghdr *__cmsg;
  uint __errnum_00;
  sock_extended_err *serr;
  sock_extended_err *psVar7;
  ulong uVar8;
  msghdr local_130;
  char control [200];
  
  local_130.msg_name = (void *)0x0;
  local_130.msg_namelen = 0;
  local_130.msg_iov = (iovec *)0x0;
  local_130.msg_iovlen = 0;
  local_130.msg_control = control;
  local_130.msg_controllen = 200;
  local_130.msg_flags = 0;
  sVar4 = recvmsg(sock,&local_130,0x2040);
  if ((int)sVar4 == -1) {
    piVar5 = __errno_location();
    __errnum_00 = -*piVar5;
    pcVar6 = strerror(__errnum_00);
    isobusfs_log(LOG_LEVEL_ERROR,"recvmsg error notification: %i (%s)",(ulong)__errnum_00,pcVar6);
  }
  else if ((local_130.msg_flags & 8U) == 0) {
    emsg->serr = (sock_extended_err *)0x0;
    emsg->tss = (scm_timestamping *)0x0;
    __cmsg = (cmsghdr *)local_130.msg_control;
    if (local_130.msg_controllen < 0x10) {
      __cmsg = (cmsghdr *)0x0;
    }
    for (; (__cmsg != (cmsghdr *)0x0 && (sVar2 = __cmsg->cmsg_len, sVar2 != 0));
        __cmsg = __cmsg_nxthdr(&local_130,__cmsg)) {
      iVar1 = __cmsg->cmsg_type;
      if (__cmsg->cmsg_level == 0x6b) {
        if (iVar1 != 4) goto LAB_00101763;
        psVar7 = (sock_extended_err *)(__cmsg + 1);
        emsg->serr = psVar7;
LAB_00101779:
        if (emsg->tss != (scm_timestamping *)0x0) {
          if (psVar7->ee_origin == '\x01') {
            if (psVar7->ee_info != 1) {
              warnx("serr: unknown ee_info: %i");
            }
            __errnum = psVar7->ee_errno;
            pcVar6 = strerror(__errnum);
            warnx("serr: tx error: %i, %s",__errnum,pcVar6);
            return psVar7->ee_errno;
          }
          if (psVar7->ee_origin == '\x04') {
            piVar3 = emsg->stats;
            if (psVar7->ee_errno != 0x2a) {
              warnx("serr: expected ENOMSG, got: %i");
            }
            (&piVar3->tskey_sch)[psVar7->ee_info != 1] = psVar7->ee_data;
            return (uint)(psVar7->ee_info != 1) * 4 + -4;
          }
          warnx("serr: wrong origin: %u");
          return 0;
        }
      }
      else {
        if (__cmsg->cmsg_level == 1) {
          if (iVar1 == 0x36) {
            piVar3 = emsg->stats;
            for (uVar8 = 0; (int)uVar8 < (int)sVar2 + -0x10;
                uVar8 = (ulong)((int)uVar8 +
                               (*(ushort *)((long)&__cmsg[1].cmsg_len + uVar8) + 3 & 0xfffffffc))) {
              if (*(short *)((long)&__cmsg[1].cmsg_len + uVar8 + 2) == 1) {
                piVar3->send = *(uint32_t *)((long)&__cmsg[1].cmsg_len + uVar8 + 4);
              }
              else {
                warnx("not supported J1939_NLA field\n");
              }
            }
          }
          else {
            if (iVar1 != 0x25) goto LAB_00101763;
            emsg->tss = (scm_timestamping *)(__cmsg + 1);
          }
        }
        else {
LAB_00101763:
          warnx("serr: not supported type: %d.%d");
        }
        psVar7 = emsg->serr;
        if (psVar7 != (sock_extended_err *)0x0) goto LAB_00101779;
      }
    }
    __errnum_00 = 0;
  }
  else {
    isobusfs_log(LOG_LEVEL_ERROR,"recvmsg error notification: truncated");
    __errnum_00 = 0xffffffea;
  }
  return __errnum_00;
}

Assistant:

int isobusfs_recv_err(int sock, struct isobusfs_err_msg *emsg)
{
	char control[200];
	struct cmsghdr *cm;
	int ret;
	struct msghdr msg = {
		.msg_control = control,
		.msg_controllen = sizeof(control),
	};

	ret = recvmsg(sock, &msg, MSG_ERRQUEUE | MSG_DONTWAIT);
	if (ret == -1) {
		ret = -errno;
		pr_err("recvmsg error notification: %i (%s)", ret, strerror(ret));
		return ret;
	}

	if (msg.msg_flags & MSG_CTRUNC) {
		pr_err("recvmsg error notification: truncated");
		return -EINVAL;
	}

	emsg->serr = NULL;
	emsg->tss = NULL;

	for (cm = CMSG_FIRSTHDR(&msg); cm && cm->cmsg_len;
	     cm = CMSG_NXTHDR(&msg, cm)) {
		isobusfs_parse_cm(emsg, cm);
		if (emsg->serr && emsg->tss)
			return isobusfs_extract_serr(emsg);
	}

	return 0;
}